

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

int Lpk_NodeCutsOneDominance(Lpk_Cut_t *pDom,Lpk_Cut_t *pCut)

{
  uint local_28;
  int local_24;
  int k;
  int i;
  Lpk_Cut_t *pCut_local;
  Lpk_Cut_t *pDom_local;
  
  local_24 = 0;
  while( true ) {
    if ((int)(*(uint *)pDom & 0x3f) <= local_24) {
      return 1;
    }
    for (local_28 = 0;
        ((int)local_28 < (int)(*(uint *)pCut & 0x3f) &&
        (pDom->pLeaves[local_24] != pCut->pLeaves[(int)local_28])); local_28 = local_28 + 1) {
    }
    if (local_28 == (*(uint *)pCut & 0x3f)) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static inline int Lpk_NodeCutsOneDominance( Lpk_Cut_t * pDom, Lpk_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nLeaves; i++ )
    {
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            if ( pDom->pLeaves[i] == pCut->pLeaves[k] )
                break;
        if ( k == (int)pCut->nLeaves ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}